

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  char *pcVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  byte *local_40;
  char **local_38;
  
  lVar5 = -(long)ptr;
joined_r0x0055ca50:
  pcVar7 = end + lVar5;
  if ((long)pcVar7 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  iVar9 = 0;
  if (0xdb < bVar1) {
    if (bVar1 == 0xff) {
      if (((byte *)ptr)[1] < 0xfe) goto switchD_0055caaf_caseD_1d;
    }
    else if (3 < bVar1 - 0xdc) goto switchD_0055caaf_caseD_1d;
    goto switchD_0055caaf_caseD_8;
  }
  local_38 = nextTokPtr;
  pbVar8 = (byte *)ptr;
  if (bVar1 != 0) {
    if (3 < bVar1 - 0xd8) goto switchD_0055caaf_caseD_1d;
switchD_0055caaf_caseD_7:
    if (pcVar7 < (char *)0x4) {
      return -2;
    }
    goto LAB_0055ce4e;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1])) {
  case 6:
    if (pcVar7 == (char *)0x2) {
      return -2;
    }
    goto LAB_0055ce4e;
  case 7:
    goto switchD_0055caaf_caseD_7;
  case 9:
  case 10:
  case 0x15:
    ptr = (char *)((byte *)ptr + 2);
    lVar5 = (long)end - (long)ptr;
    while( true ) {
      if (lVar5 < 2) {
        return -1;
      }
      if (*ptr != 0) goto switchD_0055caaf_caseD_8;
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
      if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
      ptr = (char *)((byte *)ptr + 2);
      lVar5 = lVar5 + -2;
    }
    if (bVar1 == 0xe) goto switchD_0055caaf_caseD_e;
    break;
  case 0xe:
switchD_0055caaf_caseD_e:
    local_40 = (byte *)ptr + 2;
    if ((long)end - (long)local_40 < 2) {
      return -1;
    }
    pcVar7 = end + (-4 - (long)ptr);
    while( true ) {
      iVar4 = iVar9;
      if (*local_40 != 0) goto switchD_0055cc86_caseD_0;
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
      uVar10 = (uint)bVar1;
      if ((uVar10 & 0xfffffffe) == 0xc) break;
      if ((0x15 < uVar10) || (iVar4 = 0, (0x200600U >> (uVar10 & 0x1f) & 1) == 0))
      goto switchD_0055cc86_caseD_0;
      local_40 = local_40 + 2;
      bVar3 = (long)pcVar7 < 2;
      pcVar7 = pcVar7 + -2;
      if (bVar3) {
        return -1;
      }
    }
    local_40 = local_40 + 2;
    if ((long)pcVar7 < 2) {
      return -1;
    }
    do {
      iVar9 = 0;
      bVar2 = *local_40;
      if (bVar2 < 0xdc) {
        bVar6 = 7;
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            bVar6 = *(byte *)((long)enc[1].scanners + (ulong)local_40[1]);
          }
          else {
LAB_0055cc63:
            bVar6 = 0x1d;
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        bVar6 = 8;
      }
      else if ((bVar2 != 0xff) || (bVar6 = 0, local_40[1] < 0xfe)) goto LAB_0055cc63;
      iVar4 = iVar9;
      if (bVar6 == bVar1) goto LAB_0055cd0e;
      switch(bVar6) {
      case 0:
      case 1:
      case 2:
      case 8:
        goto switchD_0055cc86_caseD_0;
      case 3:
        iVar4 = big2_scanRef(enc,(char *)(local_40 + 2),end,(char **)&local_40);
        nextTokPtr = local_38;
        if (iVar4 < 1) {
          iVar9 = 0;
          pbVar8 = local_40;
          if (iVar4 != 0) {
            return iVar4;
          }
          goto LAB_0055ce4e;
        }
        break;
      default:
        local_40 = local_40 + 2;
        break;
      case 6:
        if (pcVar7 == (char *)0x2) {
          return -2;
        }
        local_40 = local_40 + 3;
        break;
      case 7:
        if (pcVar7 < (char *)0x4) {
          return -2;
        }
        local_40 = local_40 + 4;
      }
      pcVar7 = end + -(long)local_40;
      if ((long)pcVar7 < 2) {
        return -1;
      }
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_0055caaf_caseD_16:
    ptr = (char *)((byte *)ptr + 2);
    goto switchD_0055cdae_caseD_16;
  case 0x1d:
switchD_0055caaf_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(((byte *)ptr)[1] >> 3 & 0x1c |
                         (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
         (((byte *)ptr)[1] & 0x1f) & 1) != 0) goto switchD_0055caaf_caseD_16;
  }
  goto switchD_0055caaf_caseD_8;
LAB_0055cd0e:
  pbVar8 = local_40 + 2;
  if ((long)end - (long)pbVar8 < 2) {
    return -1;
  }
  local_38 = nextTokPtr;
  if (*pbVar8 == 0) {
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)local_40[3]);
    uVar10 = (uint)bVar1;
    if (bVar1 < 0xb) {
      if (1 < uVar10 - 9) goto LAB_0055ce4e;
    }
    else if (bVar1 != 0x15) {
      if (uVar10 == 0xb) {
LAB_0055ceaf:
        iVar9 = 1;
        pbVar8 = pbVar8 + 2;
      }
      else if (uVar10 == 0x11) {
LAB_0055cec2:
        local_40 = pbVar8 + 2;
        if ((long)end - (long)local_40 < 2) {
          return -1;
        }
        if (*local_40 == 0) {
          if (pbVar8[3] == 0x3e) {
            local_40 = pbVar8 + 4;
          }
          iVar4 = (uint)(pbVar8[3] == 0x3e) * 3;
        }
switchD_0055cc86_caseD_0:
        iVar9 = iVar4;
        local_38 = nextTokPtr;
        pbVar8 = local_40;
      }
      goto LAB_0055ce4e;
    }
    pbVar8 = local_40 + 4;
    if ((long)end - (long)pbVar8 < 2) {
      return -1;
    }
    ptr = (char *)(local_40 + 6);
    pcVar7 = end + (-6 - (long)local_40);
    while( true ) {
      bVar1 = ((byte *)ptr)[-2];
      if (bVar1 != 0) break;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[-1])) {
      case 6:
        if (pcVar7 == (char *)0x0) {
          return -2;
        }
        goto switchD_0055cdae_caseD_8;
      case 7:
        goto switchD_0055cdae_caseD_7;
      default:
        goto switchD_0055cdae_caseD_8;
      case 9:
      case 10:
      case 0x15:
        pbVar8 = pbVar8 + 2;
        ptr = (char *)((byte *)ptr + 2);
        bVar3 = (long)pcVar7 < 2;
        pcVar7 = pcVar7 + -2;
        if (bVar3) {
          return -1;
        }
        break;
      case 0xb:
        pbVar8 = (byte *)ptr + -2;
        goto LAB_0055ceaf;
      case 0x11:
        pbVar8 = (byte *)ptr + -2;
        goto LAB_0055cec2;
      case 0x16:
      case 0x18:
        goto switchD_0055cdae_caseD_16;
      case 0x1d:
        goto switchD_0055cdae_caseD_1d;
      }
    }
    if (bVar1 - 0xd8 < 4) {
switchD_0055cdae_caseD_7:
      if (pcVar7 + 2 < (char *)0x4) {
        return -2;
      }
    }
    else if ((3 < bVar1 - 0xdc) && ((bVar1 != 0xff || (((byte *)ptr)[-1] < 0xfe)))) {
switchD_0055cdae_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(((byte *)ptr)[-1] >> 3 & 0x1c |
                           (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
           (((byte *)ptr)[-1] & 0x1f) & 1) != 0) {
switchD_0055cdae_caseD_16:
        lVar5 = -(long)ptr;
        goto joined_r0x0055ca50;
      }
      goto LAB_0055ce4e;
    }
switchD_0055cdae_caseD_8:
    ptr = (char *)((byte *)ptr + -2);
switchD_0055caaf_caseD_8:
    iVar9 = 0;
    local_38 = nextTokPtr;
    pbVar8 = (byte *)ptr;
  }
LAB_0055ce4e:
  *local_38 = (char *)pbVar8;
  return iVar9;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
    /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}